

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

void __thiscall
Sequence::process_cluster_list1
          (Sequence *this,shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1,
          shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster1,
          shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster2,
          shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL,int iter,int eqtype,
          Eqclass_S *parent)

{
  Env *seqstrm_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *peVar4;
  shared_ptr<Itemset> *psVar5;
  shared_ptr<Itemset> *psVar6;
  element_type *peVar7;
  reference pvVar8;
  element_type *peVar9;
  element_type *peVar10;
  __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *this_00;
  shared_ptr<Eqclass> local_1d0;
  shared_ptr<Eqclass> local_1c0;
  shared_ptr<Eqclass> local_1b0;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> local_1a0;
  shared_ptr<Eqclass> local_190;
  ListNodes<std::shared_ptr<Itemset>_> local_180;
  shared_ptr<Itemset> local_160;
  shared_ptr<Itemset> local_150;
  undefined1 local_140 [32];
  ListNodes<std::shared_ptr<Itemset>_> local_120;
  shared_ptr<Itemset> local_100;
  shared_ptr<Itemset> local_f0;
  undefined1 local_e0 [36];
  int local_bc [2];
  int msup;
  int esup;
  int lsup;
  Itemset_S mjoin;
  Itemset_S ejoin;
  Itemset_S ljoin;
  int local_6c;
  undefined1 local_68 [8];
  Eqclass_S EQ;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr2;
  ostringstream *seqstrm;
  ostringstream *logger;
  int iter_local;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL_local;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster2_local;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster1_local;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1_local;
  Sequence *this_local;
  
  seqstrm_00 = this->env;
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_6c = iter + -1;
  std::make_shared<Eqclass,int,int&>((int *)local_68,&local_6c);
  fill_seq_template((Eqclass_S *)local_68,parent,2);
  std::shared_ptr<Itemset>::shared_ptr
            ((shared_ptr<Itemset> *)
             &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Itemset>::shared_ptr
            ((shared_ptr<Itemset> *)
             &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Itemset>::shared_ptr((shared_ptr<Itemset> *)&esup);
  std::
  __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)cluster2);
  Lists<std::shared_ptr<Itemset>_>::head((Lists<std::shared_ptr<Itemset>_> *)(local_e0 + 0x10));
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)(local_e0 + 0x10));
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)(local_e0 + 0x10));
  while (bVar1 = std::__shared_ptr::operator_cast_to_bool
                           ((__shared_ptr *)
                            &EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        , bVar1) {
    peVar4 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         );
    psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
    peVar4 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)hdr1);
    psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
    peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_68);
    uVar2 = Eqclass::templ(peVar10);
    prune_decision((Sequence *)local_e0,(Itemset_S *)this,psVar5,(uint)psVar6,uVar2);
    std::shared_ptr<Itemset>::operator=
              ((shared_ptr<Itemset> *)
               &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<Itemset> *)local_e0);
    std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_e0);
    std::shared_ptr<Itemset>::shared_ptr(&local_f0,(nullptr_t)0x0);
    std::shared_ptr<Itemset>::operator=
              ((shared_ptr<Itemset> *)
               &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_f0)
    ;
    std::shared_ptr<Itemset>::~shared_ptr(&local_f0);
    std::shared_ptr<Itemset>::shared_ptr(&local_100,(nullptr_t)0x0);
    std::shared_ptr<Itemset>::operator=((shared_ptr<Itemset> *)&esup,&local_100);
    std::shared_ptr<Itemset>::~shared_ptr(&local_100);
    local_bc[0] = 0;
    local_bc[1] = 0;
    msup = 0;
    peVar13 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    if (1 < peVar13->pruning_type) {
      peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )local_68);
      uVar2 = Eqclass::templ(peVar10);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      pre_pruning(this,(Itemset_S *)
                       &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  uVar2,psVar5,psVar6,'\x01');
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      get_tmpnewf_intersect
                (this,(Itemset_S *)
                      &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Itemset_S *)
                 &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Itemset_S *)&esup,&msup,local_bc + 1,local_bc,psVar5,psVar6,iter);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      fill_join(this,(Itemset_S *)
                     &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                psVar5,psVar6);
    }
    peVar13 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    if (1 < peVar13->pruning_type) {
      peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )local_68);
      uVar2 = Eqclass::templ(peVar10);
      post_pruning(this,(Itemset_S *)
                        &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   uVar2);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar7 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->numLargeItemset);
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(peVar7,(long)(iter + -1));
      *pvVar8 = *pvVar8 + 1;
      peVar13 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->args);
      if (peVar13->outputfreq != '\0') {
        peVar9 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_68);
        uVar2 = Eqclass::templ(peVar10);
        Itemset::print_seq(peVar9,(ostream *)seqstrm_00,uVar2);
      }
      peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )local_68);
      std::shared_ptr<Itemset>::shared_ptr
                (&local_120.theItem,
                 (shared_ptr<Itemset> *)
                 &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Eqclass::append(peVar10,&local_120.theItem);
      std::shared_ptr<Itemset>::~shared_ptr(&local_120.theItem);
    }
    std::
    __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ListNodes<std::shared_ptr<Itemset>_>::next(&local_120);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
              ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
               &EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_120.theNext);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr(&local_120.theNext);
  }
  std::
  __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)hdr1);
  ListNodes<std::shared_ptr<Itemset>_>::next
            ((ListNodes<std::shared_ptr<Itemset>_> *)(local_140 + 0x10));
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)(local_140 + 0x10));
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)(local_140 + 0x10));
  while (bVar1 = std::operator!=((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
                                 &EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,(nullptr_t)0x0), bVar1) {
    peVar4 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         );
    psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
    peVar4 = std::
             __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)hdr1);
    psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
    peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_68);
    uVar2 = Eqclass::templ2(peVar10);
    prune_decision((Sequence *)local_140,(Itemset_S *)this,psVar5,(uint)psVar6,uVar2);
    std::shared_ptr<Itemset>::operator=
              ((shared_ptr<Itemset> *)
               &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<Itemset> *)local_140);
    std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)local_140);
    std::shared_ptr<Itemset>::shared_ptr(&local_150,(nullptr_t)0x0);
    std::shared_ptr<Itemset>::operator=
              ((shared_ptr<Itemset> *)
               &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_150
              );
    std::shared_ptr<Itemset>::~shared_ptr(&local_150);
    std::shared_ptr<Itemset>::shared_ptr(&local_160,(nullptr_t)0x0);
    std::shared_ptr<Itemset>::operator=((shared_ptr<Itemset> *)&esup,&local_160);
    std::shared_ptr<Itemset>::~shared_ptr(&local_160);
    local_bc[0] = 0;
    local_bc[1] = 0;
    msup = 0;
    peVar13 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    if (1 < peVar13->pruning_type) {
      peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )local_68);
      uVar2 = Eqclass::templ2(peVar10);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      pre_pruning(this,(Itemset_S *)
                       &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  uVar2,psVar5,psVar6,'\0');
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      get_tmpnewf_intersect
                (this,(Itemset_S *)
                      &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Itemset_S *)
                 &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Itemset_S *)&esup,&msup,local_bc + 1,local_bc,psVar5,psVar6,iter);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)hdr1);
      psVar5 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      peVar4 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar6 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar4);
      fill_join(this,(Itemset_S *)
                     &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                psVar5,psVar6);
    }
    peVar13 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    if (1 < peVar13->pruning_type) {
      peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )local_68);
      uVar2 = Eqclass::templ2(peVar10);
      post_pruning(this,(Itemset_S *)
                        &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   uVar2);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      peVar7 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->numLargeItemset);
      pvVar8 = std::vector<int,_std::allocator<int>_>::at(peVar7,(long)(iter + -1));
      *pvVar8 = *pvVar8 + 1;
      peVar13 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->args);
      if (peVar13->outputfreq != '\0') {
        peVar9 = std::__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Itemset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_68);
        uVar2 = Eqclass::templ2(peVar10);
        Itemset::print_seq(peVar9,(ostream *)seqstrm_00,uVar2);
      }
      peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )local_68);
      std::shared_ptr<Itemset>::shared_ptr
                (&local_180.theItem,
                 (shared_ptr<Itemset> *)
                 &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Eqclass::append2(peVar10,&local_180.theItem);
      std::shared_ptr<Itemset>::~shared_ptr(&local_180.theItem);
    }
    std::
    __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ListNodes<std::shared_ptr<Itemset>_>::next(&local_180);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
              ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
               &EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_180.theNext);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr(&local_180.theNext);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
  if (bVar1) {
    peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_68);
    p_Var11 = (__shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)Eqclass::list(peVar10);
    peVar12 = std::
              __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var11);
    iVar3 = Lists<std::shared_ptr<Itemset>_>::size(peVar12);
    if (iVar3 < 1) {
      peVar10 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )local_68);
      p_Var11 = (__shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)Eqclass::list2(peVar10);
      peVar12 = std::
                __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var11);
      iVar3 = Lists<std::shared_ptr<Itemset>_>::size(peVar12);
      if (iVar3 < 1) {
        std::shared_ptr<Eqclass>::shared_ptr(&local_1d0,(nullptr_t)0x0);
        std::shared_ptr<Eqclass>::operator=((shared_ptr<Eqclass> *)local_68,&local_1d0);
        std::shared_ptr<Eqclass>::~shared_ptr(&local_1d0);
        goto LAB_0011d167;
      }
    }
    peVar13 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->args);
    if (peVar13->recursive == 0) {
      this_00 = std::
                __shared_ptr_access<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)LargeL);
      std::shared_ptr<Eqclass>::shared_ptr(&local_1c0,(shared_ptr<Eqclass> *)local_68);
      Lists<std::shared_ptr<Eqclass>_>::append(this_00,&local_1c0);
      std::shared_ptr<Eqclass>::~shared_ptr(&local_1c0);
    }
    else {
      std::shared_ptr<Eqclass>::shared_ptr(&local_190,(shared_ptr<Eqclass> *)local_68);
      std::shared_ptr<Lists<std::shared_ptr<Eqclass>_>_>::shared_ptr(&local_1a0,(nullptr_t)0x0);
      process_cluster1(this,&local_190,&local_1a0,iter + 1);
      std::shared_ptr<Lists<std::shared_ptr<Eqclass>_>_>::~shared_ptr(&local_1a0);
      std::shared_ptr<Eqclass>::~shared_ptr(&local_190);
      std::shared_ptr<Eqclass>::shared_ptr(&local_1b0,(nullptr_t)0x0);
      std::shared_ptr<Eqclass>::operator=((shared_ptr<Eqclass> *)local_68,&local_1b0);
      std::shared_ptr<Eqclass>::~shared_ptr(&local_1b0);
    }
  }
LAB_0011d167:
  std::shared_ptr<Itemset>::~shared_ptr((shared_ptr<Itemset> *)&esup);
  std::shared_ptr<Itemset>::~shared_ptr
            ((shared_ptr<Itemset> *)
             &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Itemset>::~shared_ptr
            ((shared_ptr<Itemset> *)
             &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Eqclass>::~shared_ptr((shared_ptr<Eqclass> *)local_68);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Sequence::process_cluster_list1(shared_ptr<ListNodes<shared_ptr<Itemset>>>& hdr1,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster1,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster2,
                                     shared_ptr<Lists<Eqclass_S>>& LargeL,
                                     int iter, int eqtype, Eqclass_S& parent) {

    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr2;
    Eqclass_S EQ = make_shared<Eqclass>(iter - 1, eqtype);
    fill_seq_template(EQ, parent, 2);

    Itemset_S ljoin, ejoin, mjoin;
    int lsup, esup, msup;
    hdr2 = cluster2->head();
    for (; hdr2; hdr2 = hdr2->next()) {
        //ljoin = (Itemset_S )1;
        ljoin = prune_decision(hdr2->item(), hdr1->item(), EQ->templ(), LJOIN);
        ejoin = nullptr;
        mjoin = nullptr;
        lsup = esup = msup = 0;
        if (args->pruning_type > 1)
            pre_pruning(ljoin, EQ->templ(), hdr1->item(), hdr2->item(), 1);
        if (ljoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr2->item(), hdr1->item(), iter);
        if (ljoin) fill_join(ljoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) {
            post_pruning(ljoin, EQ->templ());
        }
        if (ljoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ljoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ljoin->print_seq(seqstrm, EQ->templ());
            EQ->append(ljoin);
        }
    }

    //hdr2 = cluster1->head();
    //for (; hdr2 != hdr1; hdr2=hdr2->next()){
    hdr2 = hdr1->next();
    for (; hdr2 != nullptr; hdr2 = hdr2->next()) {
        //ejoin = (Itemset_S )1;
        ejoin = prune_decision(hdr2->item(), hdr1->item(), EQ->templ2(), EJOIN);
        ljoin = nullptr;
        mjoin = nullptr;
        lsup = esup = msup = 0;
        if (args->pruning_type > 1)
            pre_pruning(ejoin, EQ->templ2(), hdr1->item(), hdr2->item(), 0);
        if (ejoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr2->item(), hdr1->item(), iter);
        if (ejoin) fill_join(ejoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(ejoin, EQ->templ2());
        if (ejoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ejoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ejoin->print_seq(seqstrm, EQ->templ2());
            EQ->append2(ejoin);
        }
    }

    if (EQ) {
        if ((EQ->list()->size() > 0) || (EQ->list2()->size() > 0)) {
            if (args->recursive) {
                //if (use_hash) insert_freqarray(EQ);
                process_cluster1(EQ, nullptr, iter + 1);
                EQ = nullptr;
            } else LargeL->append(EQ);
        } else {
            EQ = nullptr;
        }
    }
}